

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

void Fraig_OrderVariables(Fraig_Man_t *pMan,Fraig_Node_t *pOld,Fraig_Node_t *pNew)

{
  Fraig_Node_t *p;
  int iVar1;
  Fraig_NodeVec_t *pFVar2;
  int *piVar3;
  int nVarsAlloc;
  int fUseMuxes;
  int Number;
  int k;
  int i;
  Fraig_Node_t *pFanin;
  Fraig_Node_t *pNode;
  Fraig_Node_t *pNew_local;
  Fraig_Node_t *pOld_local;
  Fraig_Man_t *pMan_local;
  
  if (pOld == pNew) {
    __assert_fail("pOld != pNew",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                  ,0x371,"void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)")
    ;
  }
  if (((ulong)pOld & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                  ,0x372,"void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)")
    ;
  }
  if (((ulong)pNew & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                  ,0x373,"void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)")
    ;
  }
  pMan->nTravIds = pMan->nTravIds + 1;
  iVar1 = Msat_IntVecReadSize(pMan->vVarsUsed);
  Msat_IntVecFill(pMan->vVarsUsed,iVar1,0);
  Msat_IntVecClear(pMan->vVarsInt);
  Msat_IntVecPush(pMan->vVarsInt,pOld->Num);
  Msat_IntVecWriteEntry(pMan->vVarsUsed,pOld->Num,1);
  pOld->TravId = pMan->nTravIds;
  Msat_IntVecPush(pMan->vVarsInt,pNew->Num);
  Msat_IntVecWriteEntry(pMan->vVarsUsed,pNew->Num,1);
  pNew->TravId = pMan->nTravIds;
  Number = 0;
  do {
    iVar1 = Msat_IntVecReadSize(pMan->vVarsInt);
    if (iVar1 <= Number) {
      Fraig_SetupAdjacentMark(pMan,pMan->vVarsInt);
      return;
    }
    iVar1 = Msat_IntVecReadEntry(pMan->vVarsInt,Number);
    p = pMan->vNodes->pArray[iVar1];
    iVar1 = Fraig_NodeIsAnd(p);
    if (iVar1 != 0) {
      if (p->vFanins == (Fraig_NodeVec_t *)0x0) {
        if ((*(uint *)&p->field_0x18 >> 2 & 1) != 0) {
          __assert_fail("pNode->fClauses == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                        ,0x393,
                        "void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)");
        }
        iVar1 = Fraig_NodeIsMuxType(p);
        if (iVar1 == 0) {
          pFVar2 = Fraig_CollectSupergate(p,1);
          p->vFanins = pFVar2;
          Fraig_SupergateAddClauses(pMan,p,p->vFanins);
        }
        else {
          pFVar2 = Fraig_NodeVecAlloc(4);
          p->vFanins = pFVar2;
          Fraig_NodeVecPushUnique
                    (p->vFanins,
                     (Fraig_Node_t *)
                     (*(ulong *)(((ulong)p->p1 & 0xfffffffffffffffe) + 0x20) & 0xfffffffffffffffe));
          Fraig_NodeVecPushUnique
                    (p->vFanins,
                     (Fraig_Node_t *)
                     (*(ulong *)(((ulong)p->p1 & 0xfffffffffffffffe) + 0x28) & 0xfffffffffffffffe));
          Fraig_NodeVecPushUnique
                    (p->vFanins,
                     (Fraig_Node_t *)
                     (*(ulong *)(((ulong)p->p2 & 0xfffffffffffffffe) + 0x20) & 0xfffffffffffffffe));
          Fraig_NodeVecPushUnique
                    (p->vFanins,
                     (Fraig_Node_t *)
                     (*(ulong *)(((ulong)p->p2 & 0xfffffffffffffffe) + 0x28) & 0xfffffffffffffffe));
          Fraig_SupergateAddClausesMux(pMan,p);
          nMuxes = nMuxes + 1;
        }
        if (p->vFanins->nSize < 2) {
          __assert_fail("pNode->vFanins->nSize > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigSat.c"
                        ,0x3a8,
                        "void Fraig_OrderVariables(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)");
        }
        *(uint *)&p->field_0x18 = *(uint *)&p->field_0x18 & 0xfffffffb | 4;
        pMan->nVarsClauses = pMan->nVarsClauses + 1;
        *(uint *)&p->field_0x18 = *(uint *)&p->field_0x18 & 0xffffffdf | 0x20;
      }
      for (fUseMuxes = 0; fUseMuxes < p->vFanins->nSize; fUseMuxes = fUseMuxes + 1) {
        piVar3 = (int *)((ulong)p->vFanins->pArray[fUseMuxes] & 0xfffffffffffffffe);
        if (piVar3[4] != pMan->nTravIds) {
          Msat_IntVecPush(pMan->vVarsInt,*piVar3);
          Msat_IntVecWriteEntry(pMan->vVarsUsed,*piVar3,1);
          piVar3[4] = pMan->nTravIds;
        }
      }
    }
    Number = Number + 1;
  } while( true );
}

Assistant:

void Fraig_OrderVariables( Fraig_Man_t * pMan, Fraig_Node_t * pOld, Fraig_Node_t * pNew )
{
    Fraig_Node_t * pNode, * pFanin;
    int i, k, Number, fUseMuxes = 1;
    int nVarsAlloc;

    assert( pOld != pNew );
    assert( !Fraig_IsComplement(pOld) );
    assert( !Fraig_IsComplement(pNew) );

    pMan->nTravIds++;

    // clean the variables
    nVarsAlloc = Msat_IntVecReadSize(pMan->vVarsUsed);
    Msat_IntVecFill( pMan->vVarsUsed, nVarsAlloc, 0 );
    Msat_IntVecClear( pMan->vVarsInt );

    // add the first node
    Msat_IntVecPush( pMan->vVarsInt, pOld->Num );
    Msat_IntVecWriteEntry( pMan->vVarsUsed, pOld->Num, 1 );
    pOld->TravId = pMan->nTravIds;

    // add the second node
    Msat_IntVecPush( pMan->vVarsInt, pNew->Num );
    Msat_IntVecWriteEntry( pMan->vVarsUsed, pNew->Num, 1 );
    pNew->TravId = pMan->nTravIds;

    // create the variable order
    for ( i = 0; i < Msat_IntVecReadSize(pMan->vVarsInt); i++ )
    {
        // get the new node on the frontier
        Number = Msat_IntVecReadEntry(pMan->vVarsInt, i);
        pNode = pMan->vNodes->pArray[Number];
        if ( !Fraig_NodeIsAnd(pNode) )
            continue;

        // if the node does not have fanins, create them
        if ( pNode->vFanins == NULL )
        {
            // create the fanins of the supergate
            assert( pNode->fClauses == 0 );
            // detecting a fanout-free cone (experiment only)
//            Fraig_DetectFanoutFreeCone( pMan, pNode );

            if ( fUseMuxes && Fraig_NodeIsMuxType(pNode) )
            {
                pNode->vFanins = Fraig_NodeVecAlloc( 4 );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p1)->p1) );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p1)->p2) );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p2)->p1) );
                Fraig_NodeVecPushUnique( pNode->vFanins, Fraig_Regular(Fraig_Regular(pNode->p2)->p2) );
                Fraig_SupergateAddClausesMux( pMan, pNode );
//                Fraig_DetectFanoutFreeConeMux( pMan, pNode );

                nMuxes++;
            }
            else
            {
                pNode->vFanins = Fraig_CollectSupergate( pNode, fUseMuxes );
                Fraig_SupergateAddClauses( pMan, pNode, pNode->vFanins );
            }
            assert( pNode->vFanins->nSize > 1 );
            pNode->fClauses = 1;
            pMan->nVarsClauses++;

            pNode->fMark2 = 1; // goes together with Fraig_SetupAdjacentMark()
        }

        // explore the implication fanins of pNode
        for ( k = 0; k < pNode->vFanins->nSize; k++ )
        {
            pFanin = Fraig_Regular(pNode->vFanins->pArray[k]);
            if ( pFanin->TravId == pMan->nTravIds ) // already collected
                continue;
            // collect and mark
            Msat_IntVecPush( pMan->vVarsInt, pFanin->Num );
            Msat_IntVecWriteEntry( pMan->vVarsUsed, pFanin->Num, 1 );
            pFanin->TravId = pMan->nTravIds;
        }
    }

    // set up the adjacent variable information
//    Fraig_SetupAdjacent( pMan, pMan->vVarsInt );
    Fraig_SetupAdjacentMark( pMan, pMan->vVarsInt );
}